

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Offset.h
# Opt level: O2

pair<dg::Offset,_dg::Offset> dg::dda::DefinitionsMap<dg::dda::RWNode>::getInterval(DefSite *ds)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  Offset OVar3;
  pair<dg::Offset,_dg::Offset> pVar4;
  Offset local_18;
  
  uVar1 = (ds->offset).offset;
  if (uVar1 == Offset::UNKNOWN) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    return (pair<dg::Offset,_dg::Offset>)(auVar2 << 0x40);
  }
  local_18.offset = 1;
  OVar3 = Offset::operator-(&ds->len,&local_18);
  OVar3 = Offset::operator+(&ds->offset,OVar3);
  pVar4.second.offset = OVar3.offset;
  pVar4.first.offset = (ds->offset).offset;
  return pVar4;
}

Assistant:

bool isUnknown() const { return offset == UNKNOWN; }